

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

Promise<void> kj::anon_unknown_0::expectRead(AsyncInputStream *in,StringPtr expected)

{
  PromiseNode *pPVar1;
  void *pvVar2;
  TransformPromiseNodeBase *this;
  PromiseNode *in_RCX;
  ImmediatePromiseNode<kj::_::Void> *pIVar3;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_01;
  _func_int **pp_Var4;
  _func_int **elementCount;
  Own<kj::_::ChainPromiseNode> OVar5;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar6;
  Promise<void> PVar7;
  Array<char> buffer;
  Promise<unsigned_long> promise;
  Own<kj::_::PromiseNode> local_90;
  Own<kj::_::PromiseNode> local_80;
  _func_int **local_70;
  Disposer *pDStack_68;
  PromiseNode *local_60;
  void *local_58;
  _func_int **pp_Stack_50;
  undefined8 *local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pp_Var4 = (_func_int **)expected.content.ptr;
  elementCount = (_func_int **)((long)&in_RCX[-1]._vptr_PromiseNode + 7);
  if (elementCount == (_func_int **)0x0) {
    OVar6 = heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_70);
    pIVar3 = OVar6.ptr;
    in->_vptr_AsyncInputStream = local_70;
    in[1]._vptr_AsyncInputStream = (_func_int **)pDStack_68;
  }
  else {
    pvVar2 = _::HeapArrayDisposer::allocateImpl
                       (1,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    (**(code **)(*pp_Var4 + 8))(&local_90,pp_Var4,pvVar2,1,elementCount);
    local_48 = &_::HeapArrayDisposer::instance;
    local_70 = pp_Var4;
    pDStack_68 = (Disposer *)expected.content.size_;
    local_60 = in_RCX;
    local_58 = pvVar2;
    pp_Stack_50 = elementCount;
    this = (TransformPromiseNodeBase *)operator_new(0x58);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,&local_90,
               CaptureByMove<kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::$_0,kj::Array<char>>
               ::operator());
    (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045a440;
    this[1].super_PromiseNode._vptr_PromiseNode = local_70;
    this[1].dependency.disposer = pDStack_68;
    this[1].dependency.ptr = local_60;
    this[1].continuationTracePtr = pvVar2;
    this[2].super_PromiseNode._vptr_PromiseNode = elementCount;
    this[2].dependency.disposer = (Disposer *)&_::HeapArrayDisposer::instance;
    local_58 = (void *)0x0;
    pp_Stack_50 = (_func_int **)0x0;
    local_80.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,unsigned_long,kj::CaptureByMove<kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::$_0,kj::Array<char>>,kj::_::PropagateException>>
          ::instance;
    local_80.ptr = (PromiseNode *)this;
    OVar5 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_40,&local_80);
    pPVar1 = local_80.ptr;
    pIVar3 = (ImmediatePromiseNode<kj::_::Void> *)OVar5.ptr;
    *(undefined4 *)&in->_vptr_AsyncInputStream = local_40;
    *(undefined4 *)((long)&in->_vptr_AsyncInputStream + 4) = uStack_3c;
    *(undefined4 *)&in[1]._vptr_AsyncInputStream = uStack_38;
    *(undefined4 *)((long)&in[1]._vptr_AsyncInputStream + 4) = uStack_34;
    if ((TransformPromiseNodeBase *)local_80.ptr != (TransformPromiseNodeBase *)0x0) {
      local_80.ptr = (PromiseNode *)0x0;
      (**(local_80.disposer)->_vptr_Disposer)
                (local_80.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
      pIVar3 = extraout_RDX;
    }
    pp_Var4 = pp_Stack_50;
    pvVar2 = local_58;
    if (local_58 != (void *)0x0) {
      local_58 = (void *)0x0;
      pp_Stack_50 = (_func_int **)0x0;
      _::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,pvVar2,1,(size_t)pp_Var4,
                 (size_t)pp_Var4,(_func_void_void_ptr *)0x0);
      pIVar3 = extraout_RDX_00;
    }
    pPVar1 = local_90.ptr;
    if (local_90.ptr != (PromiseNode *)0x0) {
      local_90.ptr = (PromiseNode *)0x0;
      (**(local_90.disposer)->_vptr_Disposer)
                (local_90.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode)
      ;
      pIVar3 = extraout_RDX_01;
    }
  }
  PVar7.super_PromiseBase.node.ptr = (PromiseNode *)pIVar3;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)in;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> expectRead(kj::AsyncInputStream& in, kj::StringPtr expected) {
  if (expected.size() == 0) return kj::READY_NOW;

  auto buffer = kj::heapArray<char>(expected.size());

  auto promise = in.tryRead(buffer.begin(), 1, buffer.size());
  return promise.then(kj::mvCapture(buffer, [&in,expected](kj::Array<char> buffer, size_t amount) {
    if (amount == 0) {
      KJ_FAIL_ASSERT("expected data never sent", expected);
    }

    auto actual = buffer.slice(0, amount);
    if (memcmp(actual.begin(), expected.begin(), actual.size()) != 0) {
      KJ_FAIL_ASSERT("data from stream doesn't match expected", expected, actual);
    }

    return expectRead(in, expected.slice(amount));
  }));
}